

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O0

w_status w_logger_deregister_all(void)

{
  int iVar1;
  ushort local_e;
  w_status local_c;
  uint16_t i;
  
  iVar1 = w_mtx_lock(&wp_log_mtx);
  if (iVar1 == 0) {
    for (local_e = 0; local_e < 8; local_e = local_e + 1) {
      wp_log_logger_pool[local_e].valid = 0;
    }
    iVar1 = w_mtx_unlock(&wp_log_mtx);
    if (iVar1 == 0) {
      local_c = W_SUCCESS;
    }
    else {
      local_c = W_ERROR_UNLOCK_FAILED;
    }
  }
  else {
    local_c = W_ERROR_LOCK_FAILED;
  }
  return local_c;
}

Assistant:

enum w_status
w_logger_deregister_all(
    void
)
{
    uint16_t i;

    if (w_mtx_lock(&wp_log_mtx) != 0)
    {
        return W_ERROR_LOCK_FAILED;
    }

    for (i = 0; i < W_GET_ARRAY_LEN(wp_log_logger_pool); ++i)
    {
        wp_log_logger_pool[i].valid = 0;
    }

    if (w_mtx_unlock(&wp_log_mtx) != 0)
    {
        return W_ERROR_UNLOCK_FAILED;
    }

    return W_SUCCESS;
}